

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool_getparam.c
# Opt level: O3

ParameterError parse_url(GlobalConfig *global,OperationConfig *config,char *nextarg)

{
  _Bool _Var1;
  ParameterError PVar2;
  FILE *__stream;
  char *thisurl;
  uint uVar3;
  _Bool error;
  dynbuf line;
  _Bool local_55;
  int local_54;
  dynbuf local_50;
  
  if (nextarg == (char *)0x0) {
    nextarg = (char *)0x0;
  }
  else if (*nextarg == '@') {
    local_55 = false;
    uVar3 = (byte)nextarg[1] - 0x2d;
    if (uVar3 == 0) {
      uVar3 = (uint)(byte)nextarg[2];
    }
    __stream = _stdin;
    if (-uVar3 != 0) {
      __stream = fopen64(nextarg + 1,"r");
    }
    if (__stream == (FILE *)0x0) {
      PVar2 = PARAM_READ_ERROR;
    }
    else {
      local_54 = -uVar3;
      curlx_dyn_init(&local_50,0x1f9c);
      do {
        _Var1 = my_get_line((FILE *)__stream,&local_50,&local_55);
        if (!_Var1) break;
        thisurl = curlx_dyn_ptr(&local_50);
        PVar2 = add_url(global,config,thisurl,0x24);
      } while (PVar2 == PARAM_OK);
      if (local_54 != 0) {
        fclose(__stream);
      }
      curlx_dyn_free(&local_50);
      PVar2 = PARAM_OK;
      if (local_55 != false) {
        PVar2 = PARAM_READ_ERROR;
      }
      if (_Var1) {
        PVar2 = PARAM_READ_ERROR;
      }
    }
    return PVar2;
  }
  PVar2 = add_url(global,config,nextarg,0);
  return PVar2;
}

Assistant:

static ParameterError parse_url(struct GlobalConfig *global,
                                struct OperationConfig *config,
                                const char *nextarg)
{
  if(nextarg && (nextarg[0] == '@')) {
    /* read URLs from a file, treat all as -O */
    struct curlx_dynbuf line;
    ParameterError err = PARAM_OK;
    bool error = FALSE;
    bool fromstdin = !strcmp("-", &nextarg[1]);
    FILE *f;

    if(fromstdin)
      f = stdin;
    else
      f = fopen(&nextarg[1], FOPEN_READTEXT);
    if(f) {
      curlx_dyn_init(&line, 8092);
      while(my_get_line(f, &line, &error)) {
        const char *ptr = curlx_dyn_ptr(&line);
        err = add_url(global, config, ptr, GETOUT_USEREMOTE | GETOUT_NOGLOB);
        if(err)
          break;
      }
      if(!fromstdin)
        fclose(f);
      curlx_dyn_free(&line);
      if(error || err)
        return PARAM_READ_ERROR;
      return PARAM_OK;
    }
    return PARAM_READ_ERROR; /* file not found */
  }
  return add_url(global, config, nextarg, 0);
}